

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O2

char * monster_test_local_MyGame_Example_json_parser_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_type,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  char *pcVar2;
  char *mark;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if (uVar1 < 0x6865785f656e756d) {
    if (uVar1 < 0x436f6c6f72000000) {
      if ((3 < (long)end - (long)buf && (uVar1 & 0x7fffff0000000000) == 0x416e790000000000) &&
         (buf[3] == '.')) {
        pcVar2 = MyGame_Example_Any_parse_json_enum(ctx,buf + 4,end,value_type,value,aggregate);
        return pcVar2;
      }
    }
    else if ((uVar1 & 0x7fffff0000000000) == 0x466f6f0000000000) {
      if ((3 < (long)end - (long)buf) && (buf[3] == '.')) {
        pcVar2 = MyGame_Example_Foo_parse_json_enum(ctx,buf + 4,end,value_type,value,aggregate);
        return pcVar2;
      }
    }
    else if ((5 < (long)end - (long)buf && (uVar1 & 0x7fffffffff000000) == 0x436f6c6f72000000) &&
            (buf[5] == '.')) {
      pcVar2 = MyGame_Example_Color_parse_json_enum(ctx,buf + 6,end,value_type,value,aggregate);
      return pcVar2;
    }
  }
  else if (uVar1 < 0x696e745f656e756d) {
    if ((8 < (long)end - (long)buf && uVar1 == 0x6865785f656e756d) && (buf[8] == '.')) {
      pcVar2 = MyGame_Example_hex_enum_parse_json_enum(ctx,buf + 9,end,value_type,value,aggregate);
      return pcVar2;
    }
  }
  else if (uVar1 < 0x6e65675f656e756d) {
    if ((8 < (long)end - (long)buf && uVar1 == 0x696e745f656e756d) && (buf[8] == '.')) {
      pcVar2 = MyGame_Example_int_enum_parse_json_enum(ctx,buf + 9,end,value_type,value,aggregate);
      return pcVar2;
    }
  }
  else if (uVar1 == 0x6e6f74656d707479) {
    uVar1 = flatcc_json_parser_symbol_part(buf + 8,end);
    if (((4 < (long)end - (long)(buf + 8)) && ((uVar1 & 0xffffffff00000000) == 0x656e756d00000000))
       && (buf[0xc] == '.')) {
      pcVar2 = MyGame_Example_notemptyenum_parse_json_enum
                         (ctx,buf + 0xd,end,value_type,value,aggregate);
      return pcVar2;
    }
  }
  else if (((uVar1 == 0x6e65675f656e756d) && (8 < (long)end - (long)buf)) && (buf[8] == '.')) {
    pcVar2 = MyGame_Example_neg_enum_parse_json_enum(ctx,buf + 9,end,value_type,value,aggregate);
    return pcVar2;
  }
  return buf;
}

Assistant:

static const char *monster_test_local_MyGame_Example_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_type, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x6865785f656e756d) { /* branch "hex_enum" */
        if (w < 0x436f6c6f72000000) { /* branch "Color" */
            if ((w & 0xffffff0000000000) == 0x416e790000000000) { /* "Any" */
                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 3);
                if (buf != mark) {
                    buf = MyGame_Example_Any_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                } else {
                    return unmatched;
                }
            } else { /* "Any" */
                return unmatched;
            } /* "Any" */
        } else { /* branch "Color" */
            if ((w & 0xffffff0000000000) == 0x466f6f0000000000) { /* "Foo" */
                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 3);
                if (buf != mark) {
                    buf = MyGame_Example_Foo_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                } else {
                    return unmatched;
                }
            } else { /* "Foo" */
                if ((w & 0xffffffffff000000) == 0x436f6c6f72000000) { /* "Color" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 5);
                    if (buf != mark) {
                        buf = MyGame_Example_Color_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        return unmatched;
                    }
                } else { /* "Color" */
                    return unmatched;
                } /* "Color" */
            } /* "Foo" */
        } /* branch "Color" */
    } else { /* branch "hex_enum" */
        if (w < 0x696e745f656e756d) { /* branch "int_enum" */
            if (w == 0x6865785f656e756d) { /* "hex_enum" */
                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 8);
                if (buf != mark) {
                    buf = MyGame_Example_hex_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                } else {
                    return unmatched;
                }
            } else { /* "hex_enum" */
                return unmatched;
            } /* "hex_enum" */
        } else { /* branch "int_enum" */
            if (w < 0x6e65675f656e756d) { /* branch "neg_enum" */
                if (w == 0x696e745f656e756d) { /* "int_enum" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 8);
                    if (buf != mark) {
                        buf = MyGame_Example_int_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        return unmatched;
                    }
                } else { /* "int_enum" */
                    return unmatched;
                } /* "int_enum" */
            } else { /* branch "neg_enum" */
                if (w == 0x6e65675f656e756d) { /* "neg_enum" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 8);
                    if (buf != mark) {
                        buf = MyGame_Example_neg_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        goto pfguard1;
                    }
                } else { /* "neg_enum" */
                    goto pfguard1;
                } /* "neg_enum" */
                goto endpfguard1;
pfguard1:
                if (w == 0x6e6f74656d707479) { /* descend "notempty" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffffff00000000) == 0x656e756d00000000) { /* "enum" */
                        buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 4);
                        if (buf != mark) {
                            buf = MyGame_Example_notemptyenum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                        } else {
                            return unmatched;
                        }
                    } else { /* "enum" */
                        return unmatched;
                    } /* "enum" */
                } else { /* descend "notempty" */
                    return unmatched;
                } /* descend "notempty" */
endpfguard1:
                (void)0;
            } /* branch "neg_enum" */
        } /* branch "int_enum" */
    } /* branch "hex_enum" */
    return buf;
}